

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

uint32 __thiscall Clasp::Asp::PrgBody::findLit(PrgBody *this,LogicProgram *prg,Literal p)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 in_R9;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar1 = *(uint *)&this->field_0x8;
  bVar7 = (uVar1 & 0x18000000) != 0;
  uVar5 = CONCAT71((int7)((ulong)in_R9 >> 8),bVar7);
  if ((uVar1 & 0x1ffffff) != 0) {
    uVar3 = (ulong)((uVar1 & 0x1ffffff) << 2);
    uVar4 = 0;
    do {
      uVar1 = *(uint *)(&(&this[1].super_PrgNode)[bVar7].field_0x0 + uVar4 * 4);
      bVar6 = (uVar1 & 2 ^ p.rep_ ^
              *(int *)&((prg->atoms_).ebo_.buf[uVar1 >> 2]->super_PrgHead).super_PrgNode * 2) < 2;
      uVar2 = uVar4;
      if (!bVar6) {
        uVar2 = uVar5;
      }
      uVar5 = uVar2 & 0xffffffff;
      if (bVar6) {
        return (uint32)uVar2;
      }
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 - 4;
    } while (uVar3 != 0);
  }
  return 0x40000000;
}

Assistant:

uint32 PrgBody::findLit(const LogicProgram& prg, Literal p) const {
	for (const Literal* it = goals_begin(), *end = it + size(); it != end; ++it) {
		Literal x = prg.getAtom(it->var())->literal();
		if (it->sign()) x = ~x;
		if (x == p) return static_cast<uint32>(it - goals_begin());
	}
	return varMax;
}